

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::ObjectivePropagation::recomputeCapacityThreshold(ObjectivePropagation *this)

{
  bool bVar1;
  reference pvVar2;
  double *pdVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  double *in_RDI;
  double dVar7;
  HighsInt col;
  HighsInt i_1;
  HighsInt numObjNzs;
  vector<int,_std::allocator<int>_> *objNonzeros;
  HighsInt bestPos;
  double contribution;
  HighsInt worstPos;
  ObjectiveContributionTree contributionTree;
  HighsInt i;
  HighsInt numPartitions;
  vector<int,_std::allocator<int>_> *partitionStarts;
  HighsInt col_00;
  undefined8 in_stack_ffffffffffffff50;
  HighsDomain *this_00;
  ObjectivePropagation *in_stack_ffffffffffffff58;
  HighsDomain *in_stack_ffffffffffffff60;
  double *in_stack_ffffffffffffff70;
  double in_stack_ffffffffffffff78;
  double in_stack_ffffffffffffff80;
  double local_70;
  int local_64;
  int local_60;
  int local_5c;
  vector<int,_std::allocator<int>_> *local_58;
  double local_50;
  LinkType local_44;
  double local_40;
  LinkType local_34;
  CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> local_30;
  int local_18;
  HighsInt local_14;
  vector<int,_std::allocator<int>_> *local_10;
  
  local_10 = HighsObjectiveFunction::getCliquePartitionStarts((HighsObjectiveFunction *)in_RDI[1]);
  local_14 = HighsObjectiveFunction::getNumCliquePartitions((HighsObjectiveFunction *)0x5bed8e);
  dVar7 = HighsDomain::feastol((HighsDomain *)0x5beda4);
  in_RDI[6] = -dVar7;
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    ObjectiveContributionTree::ObjectiveContributionTree
              ((ObjectiveContributionTree *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
               (HighsInt)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    local_34 = ::highs::CacheMinRbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>
               ::first(&local_30);
    if (local_34 != -1) {
      in_stack_ffffffffffffff80 = *in_RDI;
      std::
      vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
      ::operator[]((vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                    *)(in_RDI + 8),(long)local_34);
      bVar1 = isFixed(in_stack_ffffffffffffff60,(HighsInt)((ulong)in_stack_ffffffffffffff58 >> 0x20)
                     );
      if (!bVar1) {
        pvVar2 = std::
                 vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                 ::operator[]((vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                               *)(in_RDI + 8),(long)local_34);
        local_40 = pvVar2->contribution;
        local_44 = ::highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::
                   last((RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *)
                        0x5bee83);
        if (local_44 != local_34) {
          pvVar2 = std::
                   vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                   ::operator[]((vector<HighsDomain::ObjectivePropagation::ObjectiveContribution,_std::allocator<HighsDomain::ObjectivePropagation::ObjectiveContribution>_>
                                 *)(in_RDI + 8),(long)local_44);
          local_40 = local_40 - pvVar2->contribution;
        }
        in_stack_ffffffffffffff70 = in_RDI + 6;
        in_stack_ffffffffffffff78 = local_40;
        dVar7 = HighsDomain::feastol((HighsDomain *)0x5beee0);
        local_50 = in_stack_ffffffffffffff78 * (1.0 - dVar7);
        pdVar3 = std::max<double>(in_stack_ffffffffffffff70,&local_50);
        in_RDI[6] = *pdVar3;
      }
    }
  }
  local_58 = HighsObjectiveFunction::getObjectiveNonzeros((HighsObjectiveFunction *)in_RDI[1]);
  sVar4 = std::vector<int,_std::allocator<int>_>::size(local_58);
  local_5c = (int)sVar4;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(long)local_14);
  for (local_60 = *pvVar5; local_60 < local_5c; local_60 = local_60 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](local_58,(long)local_60);
    local_64 = *pvVar5;
    pdVar3 = in_RDI + 6;
    dVar7 = ABS(*(double *)((long)in_RDI[2] + (long)local_64 * 8));
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)((long)*in_RDI + 800),
                        (long)local_64);
    col_00 = (HighsInt)((ulong)*pvVar6 >> 0x20);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)((long)*in_RDI + 0x308),
                        (long)local_64);
    this_00 = (HighsDomain *)*pvVar6;
    HighsDomain::feastol((HighsDomain *)0x5bf01a);
    variableType(this_00,col_00);
    local_70 = boundRange(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                          (double)in_stack_ffffffffffffff70,(HighsVarType)((ulong)dVar7 >> 0x38));
    local_70 = dVar7 * local_70;
    pdVar3 = std::max<double>(pdVar3,&local_70);
    in_RDI[6] = *pdVar3;
  }
  return;
}

Assistant:

void HighsDomain::ObjectivePropagation::recomputeCapacityThreshold() {
  const auto& partitionStarts = objFunc->getCliquePartitionStarts();
  HighsInt numPartitions = objFunc->getNumCliquePartitions();

  capacityThreshold = -domain->feastol();
  for (HighsInt i = 0; i < numPartitions; ++i) {
    ObjectiveContributionTree contributionTree(this, i);
    HighsInt worstPos = contributionTree.first();
    if (worstPos == -1) continue;
    if (domain->isFixed(objectiveLowerContributions[worstPos].col)) continue;

    double contribution = objectiveLowerContributions[worstPos].contribution;
    HighsInt bestPos = contributionTree.last();
    if (bestPos != worstPos)
      contribution -= objectiveLowerContributions[bestPos].contribution;

    capacityThreshold =
        std::max(capacityThreshold, contribution * (1.0 - domain->feastol()));
  }

  const auto& objNonzeros = objFunc->getObjectiveNonzeros();
  const HighsInt numObjNzs = objNonzeros.size();
  for (HighsInt i = partitionStarts[numPartitions]; i < numObjNzs; ++i) {
    HighsInt col = objNonzeros[i];

    capacityThreshold = std::max(
        capacityThreshold,
        std::fabs(cost[col]) *
            boundRange(domain->col_upper_[col], domain->col_lower_[col],
                       domain->feastol(), domain->variableType(col)));
  }
}